

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)2>::Copy<std::array<signed_char,6ul>const>
          (Serializer<(Diligent::SerializerMode)2> *this,array<signed_char,_6UL> *pData,size_t Size)

{
  TPointer puVar1;
  string msg;
  string local_38;
  
  puVar1 = this->m_Ptr;
  if ((char (*) [22])this->m_End < (char (*) [22])(puVar1 + Size)) {
    FormatString<char[26],char[22]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Ptr + Size <= m_End",(char (*) [22])(puVar1 + Size));
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Copy",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x15e);
    std::__cxx11::string::~string((string *)&local_38);
    puVar1 = this->m_Ptr;
  }
  this->m_Ptr = puVar1 + Size;
  return true;
}

Assistant:

bool Serializer<SerializerMode::Measure>::Copy(T* pData, size_t Size)
{
    VERIFY_EXPR(m_Ptr + Size <= m_End);
    m_Ptr += Size;
    return true;
}